

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpUtils.h
# Opt level: O0

int sendsimplehttpgetreq(SOCKET sock,char *url)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  char *__s_00;
  char *local_48;
  char *ptr;
  int count;
  char *address;
  int sendbuflen;
  char *sendbuf;
  int ret;
  char *url_local;
  SOCKET sock_local;
  
  sVar3 = strlen(url);
  __s = (char *)calloc(sVar3 + 0x100,1);
  if (__s == (char *)0x0) {
    url_local._4_4_ = 6;
  }
  else {
    local_48 = strchr(url + 7,0x2f);
    if (local_48 == (char *)0x0) {
      sVar3 = strlen(url);
      local_48 = url + sVar3;
    }
    iVar1 = (int)local_48 - (int)url;
    iVar2 = iVar1 + -7;
    if (iVar2 < 1) {
      free(__s);
      url_local._4_4_ = 3;
    }
    else {
      __s_00 = (char *)calloc((long)(iVar1 + -6),1);
      if (__s_00 == (char *)0x0) {
        free(__s);
        url_local._4_4_ = 6;
      }
      else {
        memcpy(__s_00,url + 7,(long)iVar2);
        sVar3 = strlen(__s_00);
        sprintf(__s,"GET %s HTTP/1.1\r\nHost: %s\r\n\r\n",url + sVar3 + 7,__s_00);
        free(__s_00);
        sVar3 = strlen(__s);
        url_local._4_4_ = sendall(sock,__s,(int)sVar3);
        if (url_local._4_4_ == 0) {
          free(__s);
          url_local._4_4_ = 0;
        }
        else {
          free(__s);
        }
      }
    }
  }
  return url_local._4_4_;
}

Assistant:

inline int sendsimplehttpgetreq(SOCKET sock, char* url)
{
	int ret = EXIT_FAILURE;
	char* sendbuf = NULL;
	int sendbuflen = 0;
	char* address = NULL;
	int count = 0;
	char* ptr = NULL;

	sendbuf = (char*)calloc(strlen(url)+256, 1);
	if (sendbuf == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("sendhttpgetreq error (%s) : %s(sock=%d, url=%s)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, url));
		return EXIT_OUT_OF_MEMORY;
	}

	ptr = strchr(url+strlen("http://"), '/');
	if (ptr == NULL) ptr = url+strlen(url);
	count = (int)(ptr-url-strlen("http://"));
	if (count <= 0)
	{
		PRINT_DEBUG_ERROR_OSNET(("sendhttpgetreq error (%s) : %s(sock=%d, url=%s)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_PARAMETER],
			(int)sock, url));
		free(sendbuf);
		return EXIT_INVALID_PARAMETER;
	}

	address = (char*)calloc(count+1, 1);
	if (address == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("sendhttpgetreq error (%s) : %s(sock=%d, url=%s)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, url));
		free(sendbuf);
		return EXIT_OUT_OF_MEMORY;
	}

	memcpy(address, url+strlen("http://"), count);
	sprintf(sendbuf,
		"GET %s HTTP/1.1\r\n"
		"Host: %s\r\n"
//		"Accept: text/html\r\n"
		"\r\n",
		url+strlen("http://")+strlen(address), address);
	free(address);
	sendbuflen = (int)strlen(sendbuf);
	ret = sendall(sock, sendbuf, sendbuflen);
	if (ret != EXIT_SUCCESS)
	{
		free(sendbuf);
		return ret;
	}

	free(sendbuf);

	return EXIT_SUCCESS;
}